

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O1

int SoapySDRDevice_setCommandTime(SoapySDRDevice *device,longlong timeNs,char *what)

{
  undefined1 *puVar1;
  allocator local_49;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  puVar1 = (undefined1 *)__tls_get_addr(&PTR_0014ce80);
  *puVar1 = 0;
  *(undefined4 *)(puVar1 + 0x400) = 0;
  std::__cxx11::string::string((string *)local_48,what,&local_49);
  (**(code **)(*(long *)device + 0x2b0))(device,timeNs,local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  return 0;
}

Assistant:

int SoapySDRDevice_setCommandTime(SoapySDRDevice *device, const long long timeNs, const char *what)
{
    __SOAPY_SDR_C_TRY
    device->setCommandTime(timeNs, what);
    __SOAPY_SDR_C_CATCH
}